

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O2

int annMaxSpread(ANNpointArray pa,ANNidxArray pidx,int n,int dim)

{
  int iVar1;
  int iVar2;
  int d;
  double dVar3;
  double dVar4;
  
  if (n == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (dim < 1) {
      dim = 0;
    }
    dVar3 = 0.0;
    for (d = 0; dim != d; d = d + 1) {
      dVar4 = annSpread(pa,pidx,n,d);
      iVar1 = d;
      if (dVar4 <= dVar3) {
        dVar4 = dVar3;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      dVar3 = dVar4;
    }
  }
  return iVar2;
}

Assistant:

int annMaxSpread(      // compute dimension of max spread
    ANNpointArray pa,  // point array
    ANNidxArray pidx,  // point indices
    int n,             // number of points
    int dim)           // dimension of space
{
    int max_dim = 0;       // dimension of max spread
    ANNcoord max_spr = 0;  // amount of max spread

    if (n == 0) return max_dim;  // no points, who cares?

    for (int d = 0; d < dim; d++) {  // compute spread along each dim
        ANNcoord spr = annSpread(pa, pidx, n, d);
        if (spr > max_spr) {  // bigger than current max
            max_spr = spr;
            max_dim = d;
        }
    }
    return max_dim;
}